

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O1

void __thiscall mognetwork::TcpASIOServer::~TcpASIOServer(TcpASIOServer *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  this->_vptr_TcpASIOServer = (_func_int **)&PTR__TcpASIOServer_00113af0;
  if (this->m_serverListener != (TcpASIOListener *)0x0) {
    (*(this->m_serverListener->super_IRunnable)._vptr_IRunnable[1])();
  }
  if (this->m_serverWriter != (TcpASIOWriter *)0x0) {
    (*(this->m_serverWriter->super_IRunnable)._vptr_IRunnable[1])();
  }
  if (this->m_protocolFactory != (IProtocolFactory *)0x0) {
    (*this->m_protocolFactory->_vptr_IProtocolFactory[1])();
  }
  p_Var2 = (this->m_socketList).
           super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->m_socketList) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  Mutex::~Mutex(&this->m_mutex);
  TcpServerSocket::~TcpServerSocket(&this->m_serverSocket);
  return;
}

Assistant:

TcpASIOServer::~TcpASIOServer()
  {
    delete m_serverListener;
    delete m_serverWriter;
    delete m_protocolFactory;
  }